

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpFactory.cpp
# Opt level: O0

CharOp * __thiscall xercesc_4_0::OpFactory::createCaptureOp(OpFactory *this,int number,Op *next)

{
  CharOp *this_00;
  CharOp *tmpOp;
  Op *next_local;
  int number_local;
  OpFactory *this_local;
  
  this_00 = (CharOp *)XMemory::operator_new(0x28,this->fMemoryManager);
  CharOp::CharOp(this_00,O_CAPTURE,number,this->fMemoryManager);
  Op::setNextOp((Op *)this_00,next);
  BaseRefVectorOf<xercesc_4_0::Op>::addElement
            (&this->fOpVector->super_BaseRefVectorOf<xercesc_4_0::Op>,(Op *)this_00);
  return this_00;
}

Assistant:

CharOp* OpFactory::createCaptureOp(int number, const Op* const next) {

    CharOp* tmpOp = new (fMemoryManager) CharOp(Op::O_CAPTURE, number, fMemoryManager);

    tmpOp->setNextOp(next);
    fOpVector->addElement(tmpOp);
    return tmpOp;
}